

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean levl_follower(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  bool local_1a;
  bool local_19;
  monst *mtmp_local;
  
  iVar2 = mon_has_amulet(mtmp);
  if (iVar2 == 0) {
    if (((mtmp->mtame == '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x1d & 1) == 0)) &&
       (bVar1 = is_fshk(mtmp), bVar1 == '\0')) {
      local_19 = false;
      if ((mtmp->data->mflags2 & 0x1000000) != 0) {
        local_1a = (*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0 || (u.uhave._0_1_ & 1) != 0;
        local_19 = local_1a;
      }
      mtmp_local._7_1_ = local_19;
    }
    else {
      mtmp_local._7_1_ = true;
    }
  }
  else {
    mtmp_local._7_1_ = false;
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean levl_follower(struct monst *mtmp)
{
	/* monsters with the Amulet--even pets--won't follow across levels */
	if (mon_has_amulet(mtmp)) return FALSE;

	/* some monsters will follow even while intending to flee from you */
	if (mtmp->mtame || mtmp->iswiz || is_fshk(mtmp)) return TRUE;

	/* stalking types follow, but won't when fleeing unless you hold
	   the Amulet */
	return (boolean)((mtmp->data->mflags2 & M2_STALK) &&
				(!mtmp->mflee || u.uhave.amulet));
}